

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bitwidth_t __thiscall slang::SVInt::countLeadingZs(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar9 = 0;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    uVar7 = (this->super_SVIntStorage).bitWidth;
    uVar10 = uVar7 & 0x3f;
    bVar6 = 0x40 - (char)uVar10;
    uVar7 = uVar7 + 0x3f;
    uVar8 = uVar7 >> 6;
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    if (uVar10 == 0) {
      bVar6 = 0;
      uVar10 = 0x40;
    }
    uVar4 = (puVar1[(ulong)uVar8 - 1] & puVar1[(ulong)(uVar8 * 2) - 1]) << (bVar6 & 0x3f) ^
            0xffffffffffffffff;
    if (uVar4 == 0) {
      uVar5 = 0x40;
    }
    else {
      uVar5 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x3f;
    }
    uVar9 = (uint)uVar5;
    if (0x7f < uVar7 && uVar10 == uVar9) {
      uVar10 = uVar8 * 2 - 2;
      uVar7 = uVar8 - 2;
      do {
        uVar4 = puVar1[uVar7] & puVar1[uVar10] ^ 0xffffffffffffffff;
        if (uVar4 == 0) {
          uVar9 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar9 = (uint)lVar3 ^ 0x3f;
        }
        uVar9 = (int)uVar5 + uVar9;
        uVar5 = (ulong)uVar9;
        if ((puVar1[uVar7] & puVar1[uVar10]) != 0xffffffffffffffff) {
          return uVar9;
        }
        uVar10 = uVar10 - 1;
        bVar2 = 0 < (int)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar2);
    }
  }
  return uVar9;
}

Assistant:

bitwidth_t SVInt::countLeadingZs() const {
    if (!hasUnknown())
        return 0;

    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int words = (int)getNumWords(bitWidth, false);
    int i = words - 1;
    bitwidth_t count = (bitwidth_t)std::countl_one((pVal[i + words] & pVal[i]) << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            auto elem = pVal[i + words] & pVal[i];
            if (elem == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(elem);
                break;
            }
        }
    }

    return count;
}